

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_random_pubkeys(void)

{
  byte bVar1;
  int iVar2;
  uint64_t uVar3;
  size_t size;
  int res;
  uchar firstb;
  uchar out [65];
  size_t len;
  uchar in [65];
  secp256k1_ge elem2;
  secp256k1_ge elem;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  secp256k1_ge *psVar4;
  byte local_168;
  undefined1 auStack_167 [71];
  secp256k1_ge *local_120;
  byte local_118;
  undefined1 auStack_117 [31];
  size_t in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  secp256k1_ge *in_stack_ffffffffffffff18;
  
  uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
  iVar2 = 0x21;
  if (uVar3 == 0) {
    iVar2 = 0x41;
  }
  local_120 = (secp256k1_ge *)(long)iVar2;
  uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
  if (uVar3 == 0) {
    local_120 = (secp256k1_ge *)secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
  }
  if (local_120 == (secp256k1_ge *)0x41) {
    uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
    if (uVar3 == 0) {
      uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
      in_stack_fffffffffffffe84 = 7;
      if (uVar3 != 0) {
        in_stack_fffffffffffffe84 = 6;
      }
    }
    else {
      in_stack_fffffffffffffe84 = 4;
    }
    local_118 = (byte)in_stack_fffffffffffffe84;
  }
  else {
    uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
    local_118 = 3;
    if (uVar3 != 0) {
      local_118 = 2;
    }
  }
  uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
  if (uVar3 == 0) {
    uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
    local_118 = (byte)uVar3;
  }
  if ((secp256k1_ge *)0x1 < local_120) {
    secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  if ((secp256k1_ge *)0x21 < local_120) {
    secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  iVar2 = secp256k1_eckey_pubkey_parse
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  bVar1 = local_118;
  if (iVar2 != 0) {
    psVar4 = local_120;
    iVar2 = secp256k1_eckey_pubkey_serialize
                      (local_120,
                       (uchar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (size_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1ab6,
              "test condition failed: secp256k1_eckey_pubkey_serialize(&elem, out, &size, len == 33)"
             );
      abort();
    }
    if (psVar4 != local_120) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1ab7,"test condition failed: size == len");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(auStack_117,auStack_167,(size_t)&local_120[-1].field_0x67);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1ab8,"test condition failed: secp256k1_memcmp_var(&in[1], &out[1], len-1) == 0");
      abort();
    }
    if (((local_118 != 6) && (local_118 != 7)) && (local_118 != local_168)) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1abb,"test condition failed: in[0] == out[0]");
      abort();
    }
    psVar4 = (secp256k1_ge *)0x41;
    iVar2 = secp256k1_eckey_pubkey_serialize
                      ((secp256k1_ge *)0x41,
                       (uchar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (size_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1abe,"test condition failed: secp256k1_eckey_pubkey_serialize(&elem, in, &size, 0)"
             );
      abort();
    }
    if (psVar4 != (secp256k1_ge *)0x41) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1abf,"test condition failed: size == 65");
      abort();
    }
    iVar2 = secp256k1_eckey_pubkey_parse
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                      );
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1ac0,"test condition failed: secp256k1_eckey_pubkey_parse(&elem2, in, size)");
      abort();
    }
    ge_equals_ge((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    uVar3 = secp256k1_testrand_bits(in_stack_fffffffffffffe7c);
    local_118 = 7;
    if (uVar3 != 0) {
      local_118 = 6;
    }
    iVar2 = secp256k1_eckey_pubkey_parse
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                      );
    if ((bVar1 == 2) || (bVar1 == 3)) {
      if ((uint)local_118 == bVar1 + 4) {
        if (iVar2 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0x1ac7,"test condition failed: res");
          abort();
        }
      }
      else if (iVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1ac9,"test condition failed: !res");
        abort();
      }
    }
    if (iVar2 != 0) {
      ge_equals_ge((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      iVar2 = secp256k1_eckey_pubkey_serialize
                        (psVar4,(uchar *)CONCAT44(in_stack_fffffffffffffe84,
                                                  in_stack_fffffffffffffe80),
                         (size_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1ace,
                "test condition failed: secp256k1_eckey_pubkey_serialize(&elem, out, &size, 0)");
        abort();
      }
      iVar2 = secp256k1_memcmp_var(auStack_117,auStack_167,0x40);
      if (iVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1acf,"test condition failed: secp256k1_memcmp_var(&in[1], &out[1], 64) == 0");
        abort();
      }
    }
  }
  return;
}

Assistant:

static void test_random_pubkeys(void) {
    secp256k1_ge elem;
    secp256k1_ge elem2;
    unsigned char in[65];
    /* Generate some randomly sized pubkeys. */
    size_t len = secp256k1_testrand_bits(2) == 0 ? 65 : 33;
    if (secp256k1_testrand_bits(2) == 0) {
        len = secp256k1_testrand_bits(6);
    }
    if (len == 65) {
      in[0] = secp256k1_testrand_bits(1) ? 4 : (secp256k1_testrand_bits(1) ? 6 : 7);
    } else {
      in[0] = secp256k1_testrand_bits(1) ? 2 : 3;
    }
    if (secp256k1_testrand_bits(3) == 0) {
        in[0] = secp256k1_testrand_bits(8);
    }
    if (len > 1) {
        secp256k1_testrand256(&in[1]);
    }
    if (len > 33) {
        secp256k1_testrand256(&in[33]);
    }
    if (secp256k1_eckey_pubkey_parse(&elem, in, len)) {
        unsigned char out[65];
        unsigned char firstb;
        int res;
        size_t size = len;
        firstb = in[0];
        /* If the pubkey can be parsed, it should round-trip... */
        CHECK(secp256k1_eckey_pubkey_serialize(&elem, out, &size, len == 33));
        CHECK(size == len);
        CHECK(secp256k1_memcmp_var(&in[1], &out[1], len-1) == 0);
        /* ... except for the type of hybrid inputs. */
        if ((in[0] != 6) && (in[0] != 7)) {
            CHECK(in[0] == out[0]);
        }
        size = 65;
        CHECK(secp256k1_eckey_pubkey_serialize(&elem, in, &size, 0));
        CHECK(size == 65);
        CHECK(secp256k1_eckey_pubkey_parse(&elem2, in, size));
        ge_equals_ge(&elem,&elem2);
        /* Check that the X9.62 hybrid type is checked. */
        in[0] = secp256k1_testrand_bits(1) ? 6 : 7;
        res = secp256k1_eckey_pubkey_parse(&elem2, in, size);
        if (firstb == 2 || firstb == 3) {
            if (in[0] == firstb + 4) {
              CHECK(res);
            } else {
              CHECK(!res);
            }
        }
        if (res) {
            ge_equals_ge(&elem,&elem2);
            CHECK(secp256k1_eckey_pubkey_serialize(&elem, out, &size, 0));
            CHECK(secp256k1_memcmp_var(&in[1], &out[1], 64) == 0);
        }
    }
}